

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

int cssx(double *inp,int N,double *xreg,int optmethod,int p,int d,int q,int s,int P,int D,int Q,
        double *phi,double *theta,double *PHI,double *THETA,double *exog,int r,double *wmean,
        double *var,double *loglik,double *hess,int start,int imean)

{
  size_t __size;
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint N_00;
  uint uVar5;
  double *oup;
  double *oup_00;
  long lVar6;
  double *__dest;
  ulong uVar7;
  double *A;
  reg_object obj;
  double *pdVar8;
  double *pdVar9;
  xlik_css_object __ptr;
  double *col;
  double *dx;
  int *ipiv;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  double *pdVar14;
  size_t sVar15;
  ulong uVar16;
  int M;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  undefined1 local_100 [8];
  custom_function css_min;
  void *local_c0;
  void *local_b8;
  ulong local_60;
  
  iVar13 = N - D * s;
  sVar15 = (long)iVar13 * 8;
  oup = (double *)malloc(sVar15);
  uVar10 = 0;
  N_00 = r;
  if (xreg == (double *)0x0) {
    N_00 = 0;
  }
  if (start == 0) {
    uVar7 = 0;
    if (0 < p) {
      uVar7 = (ulong)(uint)p;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      phi[uVar10] = 0.0;
    }
    uVar10 = 0;
    uVar7 = 0;
    if (0 < q) {
      uVar7 = (ulong)(uint)q;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      theta[(long)p + uVar10] = 0.0;
    }
    uVar10 = 0;
    uVar7 = 0;
    if (0 < P) {
      uVar7 = (ulong)(uint)P;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      PHI[(long)(p + q) + uVar10] = 0.0;
    }
    uVar10 = 0;
    uVar7 = 0;
    if (0 < Q) {
      uVar7 = (ulong)(uint)Q;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      THETA[(long)(p + q + P) + uVar10] = 0.0;
    }
  }
  if (D < 1) {
    uVar7 = 0;
    uVar10 = 0;
    if (0 < N) {
      uVar10 = (ulong)(uint)N;
    }
    for (; uVar3 = N, uVar10 != uVar7; uVar7 = uVar7 + 1) {
      oup[uVar7] = inp[uVar7];
    }
  }
  else {
    uVar3 = diffs(inp,N,D,s,oup);
  }
  local_60 = (ulong)uVar3;
  oup_00 = (double *)malloc((long)(int)(uVar3 - d) << 3);
  if (d < 1) {
    uVar7 = 0;
    uVar10 = 0;
    if (0 < (int)uVar3) {
      uVar10 = local_60;
    }
    for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      oup_00[uVar7] = oup[uVar7];
    }
  }
  else {
    uVar3 = diff(oup,uVar3,d,oup_00);
    local_60 = (ulong)uVar3;
  }
  lVar6 = (long)N;
  lVar21 = lVar6 * 8;
  __dest = (double *)malloc(lVar21 * (r + 1));
  iVar4 = -D;
  if (imean != 1 || iVar4 != d) {
    if (0 < (int)N_00) {
      memcpy(__dest,xreg,(ulong)N_00 * lVar21);
      N_00 = r;
    }
  }
  else {
    uVar7 = 0;
    uVar10 = 0;
    if (0 < N) {
      uVar10 = (ulong)(uint)N;
    }
    for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      __dest[uVar7] = 1.0;
    }
    if (0 < r) {
      memcpy(__dest + lVar6,xreg,(ulong)(uint)r * lVar21);
    }
    N_00 = N_00 + 1;
  }
  uVar10 = (ulong)N_00;
  M = (int)local_60;
  lVar21 = (long)M;
  __size = lVar21 * 8;
  A = (double *)malloc((long)(r + 1) * __size);
  if (0 < (int)N_00) {
    iVar2 = N;
    if (0 < D) {
      lVar19 = 0;
      uVar7 = uVar10;
      pdVar8 = __dest;
      while (bVar22 = uVar7 != 0, uVar7 = uVar7 - 1, iVar2 = iVar13, bVar22) {
        diffs(pdVar8,N,D,s,(double *)((long)A + lVar19));
        memcpy((void *)((long)__dest + lVar19),(double *)((long)A + lVar19),sVar15);
        pdVar8 = pdVar8 + lVar6;
        lVar19 = lVar19 + sVar15;
      }
    }
    if (0 < d) {
      pdVar8 = __dest;
      uVar7 = uVar10;
      pdVar9 = A;
      while (bVar22 = uVar7 != 0, uVar7 = uVar7 - 1, bVar22) {
        diff(pdVar8,iVar2,d,pdVar9);
        pdVar8 = pdVar8 + iVar2;
        pdVar9 = pdVar9 + lVar21;
      }
    }
    if (iVar4 == d) {
      memcpy(A,__dest,__size * uVar10);
    }
    iVar13 = rank(A,M,N_00);
    if (iVar13 < (int)N_00) {
      puts("Exogenous Variables are collinear. ");
      free(oup);
      free(__dest);
      free(A);
      free(oup_00);
      return 7;
    }
    obj = reg_init(M,N_00);
    sVar15 = uVar10 * 8;
    pdVar8 = (double *)malloc(sVar15 * uVar10);
    pdVar9 = (double *)malloc(__size);
    local_c0 = malloc(sVar15);
    local_b8 = malloc(sVar15);
    setIntercept(obj,0);
    regress(obj,A,oup_00,pdVar9,pdVar8,0.95);
    for (lVar6 = 0; sVar15 - lVar6 != 0; lVar6 = lVar6 + 8) {
      *(undefined8 *)((long)local_c0 + lVar6) =
           *(undefined8 *)((long)&obj->beta[0].value + lVar6 * 4);
      *(double *)((long)local_b8 + lVar6) =
           *(double *)((long)&obj->beta[0].stdErr + lVar6 * 4) * 10.0;
    }
    free(pdVar8);
    free(pdVar9);
    free_reg(obj);
  }
  __ptr = xlik_css_init(p,d,q,s,P,D,Q,N_00,M);
  iVar13 = __ptr->pq;
  lVar6 = (long)iVar13;
  sVar15 = lVar6 * 8;
  pdVar8 = (double *)malloc(sVar15);
  pdVar9 = (double *)malloc(sVar15);
  col = (double *)malloc(sVar15 * lVar6);
  dx = (double *)malloc(sVar15);
  ipiv = (int *)malloc(lVar6 << 2);
  __ptr->N = M;
  iVar2 = __ptr->offset;
  uVar11 = 0;
  uVar7 = 0;
  if (0 < p) {
    uVar7 = (ulong)(uint)p;
  }
  for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
    pdVar8[uVar11] = phi[uVar11];
  }
  uVar11 = 0;
  uVar17 = 0;
  if (0 < q) {
    uVar17 = (ulong)(uint)q;
  }
  for (; uVar17 != uVar11; uVar11 = uVar11 + 1) {
    pdVar8[(long)p + uVar11] = -theta[uVar11];
  }
  css_min.params = (void *)(long)(q + p);
  uVar11 = 0;
  uVar16 = 0;
  if (0 < P) {
    uVar16 = (ulong)(uint)P;
  }
  for (; uVar16 != uVar11; uVar11 = uVar11 + 1) {
    pdVar8[(long)css_min.params + uVar11] = PHI[uVar11];
  }
  iVar18 = q + p + P;
  uVar11 = 0;
  uVar20 = 0;
  if (0 < Q) {
    uVar20 = (ulong)(uint)Q;
  }
  for (; uVar20 != uVar11; uVar11 = uVar11 + 1) {
    pdVar8[(long)iVar18 + uVar11] = -THETA[uVar11];
  }
  if ((int)N_00 < 1) {
    __ptr->mean = 0.0;
  }
  else {
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      pdVar8[(long)(Q + iVar18) + uVar11] = *(double *)((long)local_c0 + uVar11 * 8);
    }
  }
  uVar12 = 0;
  uVar11 = 0;
  if (0 < M) {
    uVar11 = local_60;
  }
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    dVar1 = oup_00[uVar12];
    __ptr->x[(long)(iVar2 + M * 2) + uVar12] = dVar1;
    __ptr->x[(long)iVar2 + uVar12] = dVar1;
  }
  for (; lVar21 < M * 2; lVar21 = lVar21 + 1) {
    __ptr->x[iVar2 + lVar21] = 0.0;
  }
  if (0 < (int)N_00) {
    pdVar14 = A;
    for (lVar21 = (long)(M * 3); lVar21 < (int)((N_00 + 3) * M); lVar21 = lVar21 + 1) {
      __ptr->x[iVar2 + lVar21] = *pdVar14;
      pdVar14 = pdVar14 + 1;
    }
  }
  local_100 = (undefined1  [8])fcssx;
  css_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr;
  uVar3 = fminunc((custom_function *)local_100,(custom_gradient *)0x0,iVar13,pdVar8,1.0,optmethod,
                  pdVar9);
  if ((0xf < uVar3) || ((0x8011U >> (uVar3 & 0x1f) & 1) == 0)) {
    uVar3 = 1;
  }
  uVar5 = iVar13 - N_00;
  uVar12 = 0;
  uVar11 = 0;
  if (0 < (int)uVar5) {
    uVar11 = (ulong)uVar5;
  }
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    dx[uVar12] = 1.0;
  }
  uVar12 = 0;
  uVar11 = 0;
  if (0 < (int)N_00) {
    uVar11 = uVar10;
  }
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    dx[(long)(int)uVar5 + uVar12] = *(double *)((long)local_b8 + uVar12 * 8);
  }
  hessian_fd((custom_function *)local_100,pdVar9,iVar13,dx,__ptr->eps,hess);
  mtranspose(hess,iVar13,iVar13,col);
  for (uVar12 = 0; (uint)(iVar13 * iVar13) != uVar12; uVar12 = uVar12 + 1) {
    col[uVar12] = (hess[uVar12] + col[uVar12]) * (double)(M - (D * s + d)) * 0.5;
  }
  ludecomp(col,iVar13,ipiv);
  minverse(col,iVar13,ipiv,hess);
  for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
    phi[uVar12] = pdVar9[uVar12];
  }
  for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
    theta[uVar7] = -pdVar9[(long)p + uVar7];
  }
  for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
    PHI[uVar7] = pdVar9[(long)css_min.params + uVar7];
  }
  for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
    THETA[uVar7] = -pdVar9[(long)iVar18 + uVar7];
  }
  if (imean != 1 || iVar4 != d) {
    *wmean = 0.0;
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      exog[uVar10] = pdVar9[(long)(iVar18 + Q) + uVar10];
    }
  }
  else {
    *wmean = pdVar9[iVar18 + Q];
    if (1 < (int)N_00) {
      for (lVar21 = 0; uVar10 - 1 != lVar21; lVar21 = lVar21 + 1) {
        exog[lVar21] = pdVar9[(long)(iVar18 + Q) + lVar21 + 1];
      }
    }
  }
  *var = __ptr->ssq / (double)__ptr->Nmncond;
  *loglik = __ptr->loglik;
  free(pdVar8);
  free(pdVar9);
  free(oup);
  free(__dest);
  free(A);
  free(oup_00);
  free(col);
  free(dx);
  free(ipiv);
  if (0 < (int)N_00) {
    free(local_c0);
    free(local_b8);
  }
  free(__ptr);
  return uVar3;
}

Assistant:

int cssx(double *inp, int N, double *xreg, int optmethod, int p, int d, int q, int s, int P, int D, int Q,
	double *phi, double *theta, double *PHI, double *THETA,  double *exog, int r, double *wmean, double *var,double *loglik,double *hess,int start,int imean) {
	int i, pq, retval, length, offset,ret,nd,ncxreg,N1,rnk,orig,ERR;
	double *b, *tf, *x, *inp2,*dx,*thess,*x0,*XX,*U,*V,*SIG,*coeff,*sigma,*varcovar,*res;
	int *ipiv;
	double maxstep;
	xlik_css_object obj;
	reg_object fit;

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	length = N;

	nd = d + D;
	ncxreg = (xreg == NULL) ? 0 : r;

	maxstep = 1.0;

	if (start == 0) {
		for (i = 0; i < p; ++i) {
			phi[i] = 0.0;
		}
		for (i = 0; i < q; ++i) {
			theta[p + i] = 0.0;
		}
		for (i = 0; i < P; ++i) {
			PHI[p + q + i] = 0.0;
		}
		for (i = 0; i < Q; ++i) {
			THETA[p + q + P + i] = 0.0;
		}
	}

	/*

	*/

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	x0 = (double*) malloc(sizeof(double)*length*(r+1));

	if (nd == 0 && imean == 1) {
		for(i = 0; i < length;++i) {
			x0[i] = 1.0;
		}
		if (r > 0) {
			memcpy(x0+length,xreg,sizeof(double)*r*length);
		}
		ncxreg++;
	} else {
		if (ncxreg > 0) {
			memcpy(x0,xreg,sizeof(double)*ncxreg*length);
		}
	}
	XX = (double*) malloc(sizeof(double)*N*(r+1));

	if (ncxreg > 0) {
		N1 = length;
		// x0 differenced and stored back in x0. Also stored in XX
		if (D > 0) {
			N1 = length - s*D;
			for(i = 0; i < ncxreg;++i) {
				diffs(x0+length*i,length,D,s,XX+N1*i);
				memcpy(x0+N1*i,XX+N1*i,sizeof(double)*N1);
			}
		} 
		// x0 differenced to XX
		if (d > 0) {
			for(i = 0; i < ncxreg;++i) {
				diff(x0+N1*i,N1,d,XX+N*i);
			}
		} 
		// Copy x0 to XX
		if (nd == 0) {
			memcpy(XX,x0,sizeof(double)*N*ncxreg);
		}

		rnk = rank(XX,N,ncxreg);

		if (rnk < ncxreg) {
			ERR = 7;
			printf("Exogenous Variables are collinear. \n");
			free(inp2);
			free(x0);
			free(XX);
			free(x);
			return ERR;
		}

	}


	orig = 0;

	if (ncxreg > 0) {
		if (ncxreg == 1) orig = 1;

		fit = reg_init(N,ncxreg);

		varcovar = (double*)malloc(sizeof(double)*ncxreg*ncxreg);
		res = (double*)malloc(sizeof(double)*N);
		coeff = (double*)malloc(sizeof(double)*ncxreg);
		sigma = (double*)malloc(sizeof(double)*ncxreg);


		setIntercept(fit,0);
		regress(fit,XX,x,res,varcovar,0.95);

		for(i = 0; i < ncxreg;++i) {
			coeff[i] = (fit->beta+i)->value;
			sigma[i] = 10.0 * (fit->beta+i)->stdErr;
		}


		free(varcovar);
		free(res);
		free_reg(fit);
	}


	obj = xlik_css_init(p, d, q, s, P, D, Q, ncxreg, N);

	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	obj->N = N;

	offset = obj->offset;
	// Test

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (ncxreg > 0) {
		for(i = 0; i < ncxreg;++i) {
			b[p + q + P + Q + i] = coeff[i]; // exog
		}
	} else {
		obj->mean = 0.0;
	}

	

	//mdisplay(b, 1, p + q + P + Q);

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	if (ncxreg > 0) {
		for(i = 3 * N; i < (3 + ncxreg)*N; ++i) {
			obj->x[offset + i] = XX[i - 3*N];
		}
	}

	custom_function css_min = { fcssx, obj };
	retval = fminunc(&css_min, NULL, pq, b, maxstep, optmethod, tf);
	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq - ncxreg; ++i) {
		dx[i] = 1.0;
	}
	
	for(i = 0; i < ncxreg; ++i) {
		dx[pq - ncxreg + i] = sigma[i];
	}
	

	hessian_fd(&css_min, tf, pq, dx, obj->eps, hess);

	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (N - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}


	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}

	if (nd == 0 && imean == 1) {
		*wmean = tf[p + q + Q + P];
		if (ncxreg > 1) {
			for(i = 1; i < ncxreg;++i) {
				exog[i-1] = tf[p + q + Q + P + i];
			}
		}
	} else {
		*wmean = 0.0;
		for(i = 0; i < ncxreg; ++i) {
			exog[i] = tf[p + q + Q + P + i];
		}
	}
	
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
	wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double) obj->Nmncond;
	//*var = (obj->ssq) / (double) N;
	*loglik = obj->loglik;
	
	free(b);
	free(tf);
	free(inp2);
	free(x0);
	free(XX); 
	free(x);
	free(thess);
	free(dx);
	free(ipiv);
	if (ncxreg > 0) {
		free(coeff);
		free(sigma);
	}
	free_xlik_css(obj);
	return ret;
}